

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall jessilib::timer::timer(timer *this,duration_t in_period,function_t *in_callback)

{
  mutex_type *pmVar1;
  bool bVar2;
  timer_context *this_00;
  rep rVar3;
  element_type *this_01;
  element_type *local_70;
  lock_guard<std::mutex> local_68;
  lock_guard<std::mutex> lock;
  timer_manager *manager;
  function<void_(jessilib::timer_&)> local_48;
  duration_t local_28;
  function_t *local_20;
  function_t *in_callback_local;
  timer *this_local;
  duration_t in_period_local;
  
  local_20 = in_callback;
  in_callback_local = (function_t *)this;
  this_local = (timer *)in_period.__r;
  this_00 = (timer_context *)operator_new(0x88);
  local_28.__r = (rep)this_local;
  std::function<void_(jessilib::timer_&)>::function(&local_48,in_callback);
  impl::timer_context::timer_context(this_00,local_28,&local_48);
  std::shared_ptr<jessilib::impl::timer_context>::shared_ptr<jessilib::impl::timer_context,void>
            (&this->m_context,this_00);
  std::function<void_(jessilib::timer_&)>::~function(&local_48);
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&this_local);
  bVar2 = impl::_debug_assert_helper
                    (rVar3 != 0,
                     "Failed assertion: \'in_period.count() != 0\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/timer/timer.cpp:85"
                    );
  if (bVar2) {
    this_01 = std::
              __shared_ptr_access<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    bVar2 = impl::timer_context::null(this_01);
    bVar2 = impl::_debug_assert_helper
                      ((bool)(~bVar2 & 1),
                       "Failed assertion: \'!m_context->null()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/timer/timer.cpp:86"
                      );
    if (bVar2) {
      lock._M_device = (mutex_type *)impl::timer_manager::instance();
      std::lock_guard<std::mutex>::lock_guard(&local_68,&((timer_manager *)lock._M_device)->m_mutex)
      ;
      pmVar1 = lock._M_device + 8;
      local_70 = std::__shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>
                             *)this);
      std::
      multiset<jessilib::impl::timer_context_*,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
      ::insert((multiset<jessilib::impl::timer_context_*,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
                *)((long)&(pmVar1->super___mutex_base)._M_mutex + 8),&local_70);
      std::lock_guard<std::mutex>::~lock_guard(&local_68);
      std::condition_variable::notify_one();
    }
  }
  return;
}

Assistant:

timer::timer(duration_t in_period, function_t in_callback)
	: m_context{ new impl::timer_context{ in_period, std::move(in_callback) } } {
	// Add timer_context to timer_manager
	// Note: this logic must be here (rather than timer_context) to ensure timer_context is wrapped in a shared_ptr
	if (jessilib_debug_assert(in_period.count() != 0)
		&& jessilib_debug_assert(!m_context->null())) {
		// Add timer
		impl::timer_manager& manager = impl::timer_manager::instance();
		{
			std::lock_guard<std::mutex> lock(manager.m_mutex);
			manager.m_active_timers.insert(m_context.get());
		}

		// Notify
		manager.m_cvar.notify_one();
	}
}